

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::LowerGeneratorHelper::LowerCreateInterpreterStackFrameForGenerator
          (LowerGeneratorHelper *this,Instr *instr)

{
  AddrOpnd *opndArg;
  Opnd *opndArg_00;
  IntConstOpnd *opndArg_01;
  Opnd *local_38;
  Opnd *scriptFunctionOpnd;
  
  local_38 = (Opnd *)0x0;
  opndArg = CreateFunctionBodyOpnd(this->lowerer,instr->m_func);
  opndArg_00 = IR::Instr::UnlinkSrc1(instr);
  opndArg_01 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
  LowererMD::LoadFunctionObjectOpnd(this->lowererMD,instr,&local_38);
  LowererMD::LoadHelperArgument(this->lowererMD,instr,&opndArg_01->super_Opnd);
  LowererMD::LoadHelperArgument(this->lowererMD,instr,opndArg_00);
  LowererMD::LoadHelperArgument(this->lowererMD,instr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(this->lowererMD,instr,local_38);
  LowererMD::ChangeToHelperCall
            (this->lowererMD,instr,HelperCreateInterpreterStackFrameForGenerator,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return;
}

Assistant:

void
Lowerer::LowerGeneratorHelper::LowerCreateInterpreterStackFrameForGenerator(IR::Instr* instr)
{
    IR::Opnd* scriptFunctionOpnd = nullptr;
    IR::Opnd* functionBodyOpnd = this->lowerer->CreateFunctionBodyOpnd(instr->m_func);
    IR::Opnd* generatorOpnd = instr->UnlinkSrc1();
    IR::IntConstOpnd* doProfileOpnd = IR::IntConstOpnd::New(0, TyInt8, instr->m_func);

    this->lowererMD.LoadFunctionObjectOpnd(instr, scriptFunctionOpnd);

    this->lowererMD.LoadHelperArgument(instr, doProfileOpnd);
    this->lowererMD.LoadHelperArgument(instr, generatorOpnd);
    this->lowererMD.LoadHelperArgument(instr, functionBodyOpnd);
    this->lowererMD.LoadHelperArgument(instr, scriptFunctionOpnd);

    this->lowererMD.ChangeToHelperCall(instr, IR::HelperCreateInterpreterStackFrameForGenerator);
}